

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

void Term_big_putch(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char cVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  
  cVar3 = (char)a;
  if (tile_width < 2) {
    for (wVar6 = L'\x01'; (uint)wVar6 < (uint)tile_height; wVar6 = wVar6 + L'\x01') {
      if (cVar3 < '\0') {
        wVar7 = L'ÿ';
        wVar4 = L'\xffffffff';
      }
      else {
        wVar4 = L' ';
        wVar7 = L'\x01';
      }
      Term_putch(x,y + wVar6,wVar7,wVar4);
    }
  }
  else {
    for (uVar5 = 0; uVar5 < tile_width; uVar5 = uVar5 + 1) {
      wVar4 = L'\x01';
      wVar6 = wVar4;
      wVar7 = x;
      if (uVar5 != 0) {
        wVar7 = uVar5 + x;
        if (cVar3 < '\0') {
          wVar2 = L'ÿ';
          wVar1 = L'\xffffffff';
        }
        else {
          wVar1 = L' ';
          wVar2 = wVar4;
        }
        Term_putch(wVar7,y,wVar2,wVar1);
      }
      for (; (uint)wVar6 < (uint)tile_height; wVar6 = wVar6 + L'\x01') {
        if (cVar3 < '\0') {
          wVar2 = L'ÿ';
          wVar1 = L'\xffffffff';
        }
        else {
          wVar1 = L' ';
          wVar2 = wVar4;
        }
        Term_putch(wVar7,y + wVar6,wVar2,wVar1);
      }
    }
  }
  return;
}

Assistant:

void Term_big_putch(int x, int y, int a, wchar_t c)
{
	int hor, vert;

	/* Avoid warning */
	(void)c;

	/* No tall skinny tiles */
	if (tile_width > 1) {
		/* Horizontal first */
		for (hor = 0; hor < tile_width; hor++) {
			/* Queue dummy character */
			if (hor != 0) {
				if (a & 0x80)
					Term_putch(x + hor, y, 255, -1);
				else
					Term_putch(x + hor, y, COLOUR_WHITE, L' ');
			}

			/* Now vertical */
			for (vert = 1; vert < tile_height; vert++) {
				/* Queue dummy character */
				if (a & 0x80)
					Term_putch(x + hor, y + vert, 255, -1);
				else
					Term_putch(x + hor, y + vert, COLOUR_WHITE, L' ');
			}
		}
	} else {
		/* Only vertical */
		for (vert = 1; vert < tile_height; vert++) {
			/* Queue dummy character */
			if (a & 0x80)
				Term_putch(x, y + vert, 255, -1);
			else
				Term_putch(x, y + vert, COLOUR_WHITE, L' ');
		}
	}
}